

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromFilm
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  LensElementInterface *pLVar1;
  undefined8 uVar2;
  LensElementInterface *pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  int iVar11;
  undefined7 in_register_00000009;
  char cVar12;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar19;
  float fVar20;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Float t;
  Ray local_100;
  undefined1 local_d8 [16];
  undefined4 local_bc;
  Point3fi o;
  int vb;
  Float va;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_bc = (undefined4)CONCAT71(in_register_00000009,toOpticalIntercept);
  if ((DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar11 = __cxa_guard_acquire(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera)
     , iVar11 != 0)) {
    Scale(&DrawRayPathFromFilm::LensFromCamera,1.0,1.0,-1.0);
    __cxa_guard_release(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  auVar38._0_4_ = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar17._4_4_ = auVar38._0_4_;
  auVar17._0_4_ = auVar38._0_4_;
  auVar17._8_4_ = auVar38._0_4_;
  auVar17._12_4_ = auVar38._0_4_;
  auVar38._0_4_ = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar16._4_4_ = auVar38._0_4_;
  auVar16._0_4_ = auVar38._0_4_;
  auVar16._8_4_ = auVar38._0_4_;
  auVar16._12_4_ = auVar38._0_4_;
  auVar17 = vmovlhps_avx(auVar17,auVar16);
  auVar38._0_4_ = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._4_4_ = auVar38._0_4_;
  auVar25._0_4_ = auVar38._0_4_;
  auVar25._8_4_ = auVar38._0_4_;
  auVar25._12_4_ = auVar38._0_4_;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.x = auVar17._0_4_;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.y = auVar17._4_4_;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.z = auVar17._8_4_;
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar17._12_4_;
  uVar2 = vmovlps_avx(auVar25);
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar2;
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar2 >> 0x20);
  Transform::operator()(&o,&DrawRayPathFromFilm::LensFromCamera,(Point3fi *)&local_100);
  auVar38._0_4_ = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar20 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar18 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * DrawRayPathFromFilm::LensFromCamera.m.m[0][1])),
                            ZEXT416((uint)auVar38._0_4_),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[0][0]));
  auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)fVar18),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[0][2]));
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * DrawRayPathFromFilm::LensFromCamera.m.m[1][1])),
                            ZEXT416((uint)auVar38._0_4_),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[1][0]));
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar18),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[1][2]));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * DrawRayPathFromFilm::LensFromCamera.m.m[2][1])),
                            ZEXT416((uint)auVar38._0_4_),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[2][0]));
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar18),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[2][2]));
  auVar38._0_4_ = auVar16._0_4_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * auVar38._0_4_)),auVar17,auVar17);
  auVar5 = vfmadd231ss_fma(auVar5,auVar25,auVar25);
  if (0.0 < auVar5._0_4_) {
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx(auVar17,auVar26);
    auVar27 = vandps_avx(auVar16,auVar26);
    auVar26 = vandps_avx(auVar25,auVar26);
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar4);
    auVar4 = vfmadd231ss_fma(auVar4,ZEXT816(0) << 0x40,auVar26);
    fVar18 = auVar4._0_4_ / auVar5._0_4_;
    fVar20 = auVar17._0_4_ * fVar18;
    local_78 = ZEXT416((uint)(auVar38._0_4_ * fVar18));
    local_68 = ZEXT416((uint)(auVar25._0_4_ * fVar18));
    i.high = fVar20;
    i.low = fVar20;
    local_d8 = auVar25;
    local_58 = auVar16;
    auVar22._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&o,i);
    auVar22._8_56_ = extraout_var;
    uVar2 = vmovlps_avx(auVar22._0_16_);
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low
         = (float)uVar2;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high
         = (float)((ulong)uVar2 >> 0x20);
    i_00.high = (float)local_78._0_4_;
    i_00.low = (float)local_78._0_4_;
    auVar23._0_8_ =
         Interval<float>::operator+<float>
                   (&o.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar23._8_56_ = extraout_var_00;
    uVar2 = vmovlps_avx(auVar23._0_16_);
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low
         = (float)uVar2;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high
         = (float)((ulong)uVar2 >> 0x20);
    i_01.high = (float)local_68._0_4_;
    i_01.low = (float)local_68._0_4_;
    auVar24._0_8_ =
         Interval<float>::operator+<float>
                   (&o.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar24._8_56_ = extraout_var_01;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
         (Interval<float>)vmovlps_avx(auVar24._0_16_);
    auVar16 = local_58;
    auVar25 = local_d8;
  }
  auVar17 = vinsertps_avx(auVar17,auVar16,0x10);
  auVar4._4_4_ = o.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar4._0_4_ = o.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar4._8_4_ = o.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar4._12_4_ =
       o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
       high;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.z =
       (o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.
        low + o.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high) * 0.5;
  local_100.time = r->time;
  local_100.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar16 = vinsertps_avx(auVar4,ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar27._0_4_ =
       o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
       high + auVar16._0_4_;
  auVar27._4_4_ =
       o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
       low + auVar16._4_4_;
  auVar27._8_4_ = auVar16._8_4_ + 0.0;
  auVar27._12_4_ = auVar16._12_4_ + 0.0;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  auVar16 = vmulps_avx512vl(auVar27,auVar5);
  uVar2 = vmovlps_avx(auVar16);
  local_100.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
  local_100.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  uVar2 = vmovlps_avx(auVar17);
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
  local_100.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar25._0_4_;
  printf("{ ");
  FVar19 = TraceLensesFromFilm(this,r,(Ray *)0x0);
  pcVar15 = "Dashed, RGBColor[.8, .5, .5]";
  if (FVar19 != 0.0) {
    pcVar15 = "RGBColor[.5, .5, .8]";
  }
  if (NAN(FVar19)) {
    pcVar15 = "RGBColor[.5, .5, .8]";
  }
  printf(pcVar15);
  auVar38._0_4_ = 0.0;
  uVar13 = (uint)(this->elementInterfaces).nStored;
  do {
    uVar14 = uVar13 - 1;
    if ((int)uVar14 < 0) break;
    uVar10 = uVar14 & 0x7fffffff;
    pLVar3 = (this->elementInterfaces).ptr;
    pLVar1 = pLVar3 + uVar10;
    auVar38._0_4_ = auVar38._0_4_ - pLVar3[uVar10].thickness;
    fVar20 = pLVar3[uVar10].curvatureRadius;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low
         = 0.0;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high
         = 0.0;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low
         = 0.0;
    local_d8._0_4_ = auVar38._0_4_;
    if ((fVar20 != 0.0) || (NAN(fVar20))) {
      bVar9 = IntersectSphericalElement
                        (pLVar1->curvatureRadius,auVar38._0_4_ + pLVar1->curvatureRadius,&local_100,
                         &t,(Normal3f *)&o);
      if (bVar9) goto LAB_00353883;
      cVar12 = !bVar9 * '\x05';
      auVar38._0_4_ = (float)local_d8._0_4_;
    }
    else {
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(ZEXT416((uint)(local_100.o.super_Tuple3<pbrt::Point3,_float>.z -
                                              auVar38._0_4_)),auVar6);
      t = auVar17._0_4_ / local_100.d.super_Tuple3<pbrt::Vector3,_float>.z;
LAB_00353883:
      va = t;
      vb = 0;
      if (t < 0.0) {
        LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                   ,0x463,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x4ba120,
                   (char (*) [2])0x28e1834,(char (*) [2])0x4ba120,&va,(char (*) [2])0x28e1834,&vb);
      }
      printf(", Line[{{%f, %f}, {%f, %f}}]",(double)local_100.o.super_Tuple3<pbrt::Point3,_float>.z,
             (double)local_100.o.super_Tuple3<pbrt::Point3,_float>.x,
             (double)(local_100.o.super_Tuple3<pbrt::Point3,_float>.z +
                     t * local_100.d.super_Tuple3<pbrt::Vector3,_float>.z),
             (double)(local_100.o.super_Tuple3<pbrt::Point3,_float>.x +
                     t * local_100.d.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar37._4_4_ = local_100.d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar37._0_4_ = local_100.d.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar37._8_8_ = 0;
      auVar28._0_4_ =
           t * local_100.d.super_Tuple3<pbrt::Vector3,_float>.x +
           local_100.o.super_Tuple3<pbrt::Point3,_float>.x;
      auVar28._4_4_ =
           t * local_100.d.super_Tuple3<pbrt::Vector3,_float>.y +
           local_100.o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar28._8_4_ = t * 0.0 + 0.0;
      auVar28._12_4_ = t * 0.0 + 0.0;
      auVar33._0_4_ = auVar28._0_4_ * auVar28._0_4_;
      auVar33._4_4_ = auVar28._4_4_ * auVar28._4_4_;
      auVar33._8_4_ = auVar28._8_4_ * auVar28._8_4_;
      auVar33._12_4_ = auVar28._12_4_ * auVar28._12_4_;
      auVar17 = vmovshdup_avx(auVar33);
      auVar17 = vfmadd231ss_fma(auVar17,auVar28,auVar28);
      cVar12 = '\x05';
      auVar38._0_4_ = (float)local_d8._0_4_;
      if (auVar17._0_4_ <= pLVar1->apertureRadius * pLVar1->apertureRadius) {
        cVar12 = '\0';
        local_100.o.super_Tuple3<pbrt::Point3,_float>.z =
             t * local_100.d.super_Tuple3<pbrt::Vector3,_float>.z +
             local_100.o.super_Tuple3<pbrt::Point3,_float>.z;
        uVar2 = vmovlps_avx(auVar28);
        local_100.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
        local_100.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar2 >> 0x20);
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          auVar17 = SUB6416(ZEXT464(0x3f800000),0);
          if (uVar13 != 1) {
            auVar38._0_4_ = (this->elementInterfaces).ptr[uVar13 - 2].eta;
            if ((auVar38._0_4_ != 0.0) || (NAN(auVar38._0_4_))) {
              auVar17 = ZEXT416((uint)auVar38._0_4_);
            }
          }
          auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_100.d.super_Tuple3<pbrt::Vector3,_float>.y
                                                  * local_100.d.super_Tuple3<pbrt::Vector3,_float>.y
                                                  )),auVar37,auVar37);
          auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_100.d.
                                                          super_Tuple3<pbrt::Vector3,_float>.z),
                                    ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.z))
          ;
          if (auVar16._0_4_ < 0.0) {
            local_58._0_4_ = auVar17._0_4_;
            local_68._0_4_ = pLVar1->eta;
            local_78 = ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.y);
            local_48 = ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.z);
            auVar38._0_4_ = sqrtf(auVar16._0_4_);
            auVar17 = ZEXT416((uint)local_58._0_4_);
            FVar19 = (Float)local_68._0_4_;
            auVar16 = local_78;
            auVar25 = local_48;
          }
          else {
            auVar16 = vsqrtss_avx(auVar16,auVar16);
            auVar38._0_4_ = auVar16._0_4_;
            FVar19 = pLVar1->eta;
            auVar16 = ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.y);
            auVar25 = ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.z);
          }
          auVar29._0_8_ = auVar25._0_8_ ^ 0x8000000080000000;
          auVar29._8_4_ = auVar25._8_4_ ^ 0x80000000;
          auVar29._12_4_ = auVar25._12_4_ ^ 0x80000000;
          auVar16 = vinsertps_avx(auVar37,auVar16,0x10);
          auVar34._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
          auVar34._8_4_ = auVar16._8_4_ ^ 0x80000000;
          auVar34._12_4_ = auVar16._12_4_ ^ 0x80000000;
          auVar36._4_4_ = auVar38._0_4_;
          auVar36._0_4_ = auVar38._0_4_;
          auVar36._8_4_ = auVar38._0_4_;
          auVar36._12_4_ = auVar38._0_4_;
          auVar16 = vdivps_avx(auVar34,auVar36);
          auVar5 = vmovshdup_avx(auVar16);
          auVar38._0_4_ = -auVar25._0_4_ / auVar38._0_4_;
          auVar38._4_12_ = auVar29._4_12_;
          auVar39._0_4_ = auVar17._0_4_ / FVar19;
          auVar39._4_12_ = auVar17._4_12_;
          auVar17 = vfmadd132ss_fma(auVar5,ZEXT416((uint)(auVar38._0_4_ *
                                                         o.super_Point3<pbrt::Interval<float>_>.
                                                                                                                  
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low)),
                                    ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.high));
          auVar25 = vfmsub213ss_fma(ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low),auVar38,
                                    ZEXT416((uint)(auVar38._0_4_ *
                                                  o.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .y.low)));
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ + auVar25._0_4_)),auVar16,
                                    ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
                                                  .x.low));
          auVar17 = vfnmadd213ss_fma(auVar25,auVar25,SUB6416(ZEXT464(0x3f800000),0));
          fVar20 = 0.0;
          auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x20);
          fVar18 = auVar17._0_4_ / (auVar39._0_4_ * auVar39._0_4_);
          auVar30._12_4_ = 0;
          auVar30._0_12_ = ZEXT812(0);
          auVar30 = auVar30 << 0x20;
          if (fVar18 < 1.0) {
            auVar17 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar18)),ZEXT416(0) << 0x20);
            if (auVar17._0_4_ < 0.0) {
              local_58._0_4_ = auVar38._0_4_;
              local_48._0_4_ = auVar25._0_4_;
              local_78 = auVar16;
              local_68 = auVar39;
              fVar20 = sqrtf(auVar17._0_4_);
              auVar25 = ZEXT416((uint)local_48._0_4_);
              auVar39._0_4_ = local_68._0_4_;
              auVar16 = local_78;
              auVar38._0_4_ = (float)local_58._0_4_;
            }
            else {
              auVar17 = vsqrtss_avx(auVar17,auVar17);
              fVar20 = auVar17._0_4_;
            }
            fVar20 = auVar25._0_4_ / auVar39._0_4_ - fVar20;
            auVar31._4_4_ = auVar39._0_4_;
            auVar31._0_4_ = auVar39._0_4_;
            auVar31._8_4_ = auVar39._0_4_;
            auVar31._12_4_ = auVar39._0_4_;
            auVar17 = vdivps_avx(auVar16,auVar31);
            auVar21._0_4_ =
                 fVar20 * o.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
            auVar21._4_4_ =
                 fVar20 * o.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
            auVar21._8_4_ = fVar20 * 0.0;
            auVar21._12_4_ = fVar20 * 0.0;
            auVar30 = vsubps_avx(auVar21,auVar17);
            fVar20 = fVar20 * o.super_Point3<pbrt::Interval<float>_>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low -
                     auVar38._0_4_ / auVar39._0_4_;
          }
          cVar12 = '\x05';
          auVar38._0_4_ = (float)local_d8._0_4_;
          if (fVar18 < 1.0) {
            uVar2 = vmovlps_avx(auVar30);
            local_100.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
            local_100.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
            cVar12 = '\0';
            local_100.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar20;
          }
        }
      }
    }
    uVar13 = uVar14;
  } while (cVar12 == '\0');
  if ((int)uVar14 < 0) {
    local_d8._0_4_ = auVar38._0_4_;
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_100.d.super_Tuple3<pbrt::Vector3,_float>.y *
                                            local_100.d.super_Tuple3<pbrt::Vector3,_float>.y)),
                              ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.x),
                              ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.x));
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.z),
                              ZEXT416((uint)local_100.d.super_Tuple3<pbrt::Vector3,_float>.z),
                              auVar17);
    if (auVar17._0_4_ < 0.0) {
      auVar38._0_4_ = sqrtf(auVar17._0_4_);
    }
    else {
      auVar17 = vsqrtss_avx(auVar17,auVar17);
      auVar38._0_4_ = auVar17._0_4_;
    }
    auVar32._4_4_ = local_100.d.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar32._0_4_ = local_100.d.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar32._8_8_ = 0;
    auVar35._4_4_ = auVar38._0_4_;
    auVar35._0_4_ = auVar38._0_4_;
    auVar35._8_4_ = auVar38._0_4_;
    auVar35._12_4_ = auVar38._0_4_;
    auVar17 = vdivps_avx(auVar32,auVar35);
    local_100.d.super_Tuple3<pbrt::Vector3,_float>.z =
         local_100.d.super_Tuple3<pbrt::Vector3,_float>.z / auVar38._0_4_;
    uVar2 = vmovlps_avx(auVar17);
    local_100.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
    local_100.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar2 >> 0x20);
    cVar12 = (char)local_bc;
    if (cVar12 == '\0') {
      auVar8._8_4_ = 0x7fffffff;
      auVar8._0_8_ = 0x7fffffff7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      local_d8 = vandps_avx512vl(ZEXT416((uint)((float)local_d8._0_4_ * 0.25)),auVar8);
    }
    else {
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(ZEXT416((uint)local_100.o.super_Tuple3<pbrt::Point3,_float>.x),
                                auVar7);
      local_d8._0_4_ = auVar17._0_4_ / local_100.d.super_Tuple3<pbrt::Vector3,_float>.x;
      local_d8._4_12_ = auVar17._4_12_;
      printf(", Point[{%f, %f}]",
             (double)(local_100.d.super_Tuple3<pbrt::Vector3,_float>.z * (float)local_d8._0_4_ +
                     local_100.o.super_Tuple3<pbrt::Point3,_float>.z),
             (double)(local_100.o.super_Tuple3<pbrt::Point3,_float>.x +
                     local_100.d.super_Tuple3<pbrt::Vector3,_float>.x * (float)local_d8._0_4_));
    }
    pcVar15 = "Line";
    if (arrow) {
      pcVar15 = "Arrow";
    }
    printf(", %s[{{%f, %f}, {%f, %f}}]",(double)local_100.o.super_Tuple3<pbrt::Point3,_float>.z,
           (double)local_100.o.super_Tuple3<pbrt::Point3,_float>.x,
           (double)(local_100.o.super_Tuple3<pbrt::Point3,_float>.z +
                   (float)local_d8._0_4_ * local_100.d.super_Tuple3<pbrt::Vector3,_float>.z),
           (double)(local_100.o.super_Tuple3<pbrt::Point3,_float>.x +
                   (float)local_d8._0_4_ * local_100.d.super_Tuple3<pbrt::Vector3,_float>.x),pcVar15
          );
    if (cVar12 != '\0') {
      printf(", Line[{{%f, 0}, {%f, 0}}]",(double)local_100.o.super_Tuple3<pbrt::Point3,_float>.z,
             (double)((local_100.o.super_Tuple3<pbrt::Point3,_float>.z +
                      (float)local_d8._0_4_ * local_100.d.super_Tuple3<pbrt::Vector3,_float>.z) *
                     1.05));
    }
  }
  putchar(0x7d);
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromFilm(const Ray &r, bool arrow,
                                          bool toOpticalIntercept) const {
    Float elementZ = 0;
    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    printf("{ ");
    if (TraceLensesFromFilm(r, nullptr) == 0) {
        printf("Dashed, RGBColor[.8, .5, .5]");
    } else
        printf("RGBColor[.5, .5, .8]");

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        elementZ -= element.thickness;
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                goto done;
        }
        CHECK_GE(t, 0);

        printf(", Line[{{%f, %f}, {%f, %f}}]", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            goto done;
        ray.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                goto done;
            ray.d = wt;
        }
    }

    ray.d = Normalize(ray.d);
    {
        Float ta = std::abs(elementZ / 4);
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf(", Point[{%f, %f}]", ray(ta).z, ray(ta).x);
        }
        printf(", %s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);

        // overdraw the optical axis if needed...
        if (toOpticalIntercept)
            printf(", Line[{{%f, 0}, {%f, 0}}]", ray.o.z, ray(ta).z * 1.05f);
    }

done:
    printf("}");
}